

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsappcurses.cc
# Opt level: O0

void __thiscall
FrobTadsApplicationCurses::scrollRegionDown
          (FrobTadsApplicationCurses *this,int top,int left,int bottom,int right,int attrs)

{
  int in_ECX;
  chtype in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int i;
  chtype c;
  int x;
  int y;
  chtype in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_24;
  undefined4 local_20;
  
  for (local_20 = in_ESI; local_24 = in_EDX, local_20 < in_ECX; local_20 = local_20 + 1) {
    for (; (int)local_24 <= in_R8D; local_24 = local_24 + 1) {
      std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::operator->
                ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)0x21bd22);
      in_stack_ffffffffffffffc4 = local_24;
      std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::operator->
                ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)0x21bd47);
      FrobTadsWindow::charAt
                ((FrobTadsWindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      FrobTadsWindow::printChar
                ((FrobTadsWindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffc4);
    }
  }
  for (; (int)in_EDX <= in_R8D; in_EDX = in_EDX + 1) {
    std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::operator->
              ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)0x21bdba);
    FrobTadsWindow::printChar
              ((FrobTadsWindow *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffffc4);
  }
  if ((*(byte *)(in_RDI + 0xb) & 1) != 0) {
    std::unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_>::operator->
              ((unique_ptr<FrobTadsWindow,_std::default_delete<FrobTadsWindow>_> *)0x21bdf7);
    FrobTadsWindow::flush((FrobTadsWindow *)0x21bdff);
  }
  return;
}

Assistant:

void
FrobTadsApplicationCurses::scrollRegionDown( int top, int left, int bottom, int right, int attrs )
{
    // This works like scrollRegionUp(), just the other way around.
    for (int y = top; y < bottom; ++y) {
        for (int x = left; x <= right; ++x) {
            this->fGameWindow->printChar(y, x, this->fGameWindow->charAt(y+1, x));
        }
    }
    const chtype c = attrs | ' ';
    for (int i = left; i <= right; ++i) this->fGameWindow->printChar(bottom, i, c);
    if (this->options.softScroll) this->fGameWindow->flush();
}